

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::FromPropertyDescriptor
              (PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  byte bVar2;
  bool bVar3;
  DynamicObject *instance;
  JavascriptFunction *pJVar4;
  Var pvVar5;
  PropertyId propertyId;
  
  instance = JavascriptLibrary::CreateObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  bVar2 = descriptor->writableSpecified;
  if (descriptor->valueSpecified == false && (Type)bVar2 == false) {
    if (descriptor->setterSpecified == false && descriptor->getterSpecified == false)
    goto LAB_009a78b1;
    pJVar4 = (JavascriptFunction *)PropertyDescriptor::GetGetter(descriptor);
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if ((pJVar4 == (JavascriptFunction *)0x0) ||
       ((pJVar1->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == pJVar4)) {
      pJVar4 = (JavascriptFunction *)(pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    InitProperty(&instance->super_RecyclableObject,0x198,pJVar4,PropertyOperation_None);
    pJVar4 = (JavascriptFunction *)PropertyDescriptor::GetSetter(descriptor);
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if ((pJVar4 == (JavascriptFunction *)0x0) ||
       ((pJVar1->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == pJVar4)) {
      pJVar4 = (JavascriptFunction *)(pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    propertyId = 0x19b;
  }
  else {
    if (descriptor->valueSpecified != false) {
      InitProperty(&instance->super_RecyclableObject,0x197,(descriptor->Value).ptr,
                   PropertyOperation_None);
      bVar2 = descriptor->writableSpecified;
    }
    if ((bVar2 & 1) == 0) goto LAB_009a78b1;
    bVar3 = PropertyDescriptor::IsWritable(descriptor);
    pJVar4 = (JavascriptFunction *)JavascriptBoolean::ToVar((uint)bVar3,scriptContext);
    propertyId = 0x196;
  }
  InitProperty(&instance->super_RecyclableObject,propertyId,pJVar4,PropertyOperation_None);
LAB_009a78b1:
  if (descriptor->enumerableSpecified == true) {
    bVar3 = PropertyDescriptor::IsEnumerable(descriptor);
    pvVar5 = JavascriptBoolean::ToVar((uint)bVar3,scriptContext);
    InitProperty(&instance->super_RecyclableObject,0x194,pvVar5,PropertyOperation_None);
  }
  if (descriptor->configurableSpecified == true) {
    bVar3 = PropertyDescriptor::IsConfigurable(descriptor);
    pvVar5 = JavascriptBoolean::ToVar((uint)bVar3,scriptContext);
    InitProperty(&instance->super_RecyclableObject,0x195,pvVar5,PropertyOperation_None);
  }
  return instance;
}

Assistant:

Var JavascriptOperators::FromPropertyDescriptor(const PropertyDescriptor& descriptor, ScriptContext* scriptContext)
    {
        DynamicObject* object = scriptContext->GetLibrary()->CreateObject();

        // ES5 Section 8.10.4 specifies the order for adding these properties.
        if (descriptor.IsDataDescriptor())
        {
            if (descriptor.ValueSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::value, descriptor.GetValue());
            }
            if (descriptor.WritableSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::writable, JavascriptBoolean::ToVar(descriptor.IsWritable(), scriptContext));
            }
        }
        else if (descriptor.IsAccessorDescriptor())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::get, JavascriptOperators::CanonicalizeAccessor(descriptor.GetGetter(), scriptContext));
            JavascriptOperators::InitProperty(object, PropertyIds::set, JavascriptOperators::CanonicalizeAccessor(descriptor.GetSetter(), scriptContext));
        }

        if (descriptor.EnumerableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::enumerable, JavascriptBoolean::ToVar(descriptor.IsEnumerable(), scriptContext));
        }
        if (descriptor.ConfigurableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::configurable, JavascriptBoolean::ToVar(descriptor.IsConfigurable(), scriptContext));
        }
        return object;
    }